

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

PgHdr * sqlite3PcacheDirtyList(PCache *pCache)

{
  PgHdr *pPVar1;
  long *in_RDI;
  PgHdr *p;
  undefined8 local_10;
  
  for (local_10 = *in_RDI; local_10 != 0; local_10 = *(long *)(local_10 + 0x40)) {
    *(undefined8 *)(local_10 + 0x20) = *(undefined8 *)(local_10 + 0x40);
  }
  pPVar1 = pcacheSortDirtyList(p);
  return pPVar1;
}

Assistant:

SQLITE_PRIVATE PgHdr *sqlite3PcacheDirtyList(PCache *pCache){
  PgHdr *p;
  for(p=pCache->pDirty; p; p=p->pDirtyNext){
    p->pDirty = p->pDirtyNext;
  }
  return pcacheSortDirtyList(pCache->pDirty);
}